

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O3

void __thiscall
Catch::UnaryExpr<bool>::streamReconstructedExpression(UnaryExpr<bool> *this,ostream *os)

{
  bool in_DL;
  string local_30;
  
  StringMaker<bool,void>::convert_abi_cxx11_
            (&local_30,
             (StringMaker<bool,void> *)(ulong)(byte)(this->super_ITransientExpression).field_0xa,
             in_DL);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }